

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_port.cc
# Opt level: O0

bool __thiscall
raptor::anon_unknown_5::DoSplitHostPort
          (anon_unknown_5 *this,StringView name,StringView *host,StringView *port,bool *has_port)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  StringView SVar4;
  StringView local_b8;
  char *local_a8;
  size_t local_a0;
  StringView local_98;
  size_t local_88;
  size_t colon;
  size_t local_78;
  StringView local_70;
  StringView local_60;
  StringView local_50;
  size_t local_40;
  size_t rbracket;
  bool *has_port_local;
  StringView *port_local;
  StringView *host_local;
  StringView name_local;
  
  port_local = (StringView *)name._size;
  name_local._ptr = name._ptr;
  *(undefined1 *)&port->_ptr = 0;
  rbracket = (size_t)port;
  has_port_local = (bool *)host;
  host_local = (StringView *)this;
  pcVar1 = StringView::operator[]((StringView *)&host_local,0);
  if (*pcVar1 == '[') {
    sVar2 = StringView::find((StringView *)&host_local,']',1);
    if (sVar2 == 0xffffffffffffffff) {
      return false;
    }
    local_40 = sVar2;
    sVar3 = StringView::size((StringView *)&host_local);
    if (sVar2 == sVar3 - 1) {
      StringView::StringView(&local_50);
      *(char **)has_port_local = local_50._ptr;
      *(size_t *)(has_port_local + 8) = local_50._size;
    }
    else {
      pcVar1 = StringView::operator[]((StringView *)&host_local,local_40 + 1);
      if (*pcVar1 != ':') {
        return false;
      }
      sVar2 = local_40 + 2;
      sVar3 = StringView::size((StringView *)&host_local);
      local_60 = StringView::substr((StringView *)&host_local,sVar2,(sVar3 - local_40) - 2);
      *(char **)has_port_local = local_60._ptr;
      *(size_t *)(has_port_local + 8) = local_60._size;
      *(undefined1 *)rbracket = 1;
    }
    local_70 = StringView::substr((StringView *)&host_local,1,local_40 - 1);
    port_local->_ptr = local_70._ptr;
    port_local->_size = local_70._size;
    sVar2 = StringView::find(port_local,':',0);
    if (sVar2 == 0xffffffffffffffff) {
      StringView::StringView((StringView *)&colon);
      port_local->_ptr = (char *)colon;
      port_local->_size = local_78;
      return false;
    }
  }
  else {
    local_88 = StringView::find((StringView *)&host_local,':',0);
    if ((local_88 == 0xffffffffffffffff) ||
       (sVar2 = StringView::find((StringView *)&host_local,':',local_88 + 1),
       sVar2 != 0xffffffffffffffff)) {
      port_local->_ptr = (char *)host_local;
      port_local->_size = (size_t)name_local._ptr;
      StringView::StringView(&local_b8);
      *(char **)has_port_local = local_b8._ptr;
      *(size_t *)(has_port_local + 8) = local_b8._size;
    }
    else {
      local_98 = StringView::substr((StringView *)&host_local,0,local_88);
      port_local->_ptr = local_98._ptr;
      port_local->_size = local_98._size;
      sVar2 = local_88 + 1;
      sVar3 = StringView::size((StringView *)&host_local);
      SVar4 = StringView::substr((StringView *)&host_local,sVar2,(sVar3 - local_88) - 1);
      local_a8 = SVar4._ptr;
      *(char **)has_port_local = local_a8;
      local_a0 = SVar4._size;
      *(size_t *)(has_port_local + 8) = local_a0;
      *(undefined1 *)rbracket = 1;
    }
  }
  return true;
}

Assistant:

bool DoSplitHostPort(StringView name, StringView* host, StringView* port,
                     bool* has_port) {
    *has_port = false;
    if (name[0] == '[') {
        /* Parse a bracketed host, typically an IPv6 literal. */
        const size_t rbracket = name.find(']', 1);
        if (rbracket == StringView::npos) {
            /* Unmatched [ */
            return false;
        }
        if (rbracket == name.size() - 1) {
            /* ]<end> */
            *port = StringView();
        } else if (name[rbracket + 1] == ':') {
            /* ]:<port?> */
            *port = name.substr(rbracket + 2, name.size() - rbracket - 2);
            *has_port = true;
        } else {
            /* ]<invalid> */
            return false;
        }
        *host = name.substr(1, rbracket - 1);
        if (host->find(':') == StringView::npos) {
            /* Require all bracketed hosts to contain a colon, because a hostname or
                IPv4 address should never use brackets. */
            *host = StringView();
            return false;
        }
    } else {
        size_t colon = name.find(':');
        if (colon != StringView::npos &&
            name.find(':', colon + 1) == StringView::npos) {
            /* Exactly 1 colon.  Split into host:port. */
            *host = name.substr(0, colon);
            *port = name.substr(colon + 1, name.size() - colon - 1);
            *has_port = true;
        } else {
            /* 0 or 2+ colons.  Bare hostname or IPv6 litearal. */
            *host = name;
            *port = StringView();
        }
    }
    return true;
}